

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

uint64_t pbrt::MixBits(uint64_t v)

{
  ulong uVar1;
  
  uVar1 = (v >> 0x1f ^ v) * 0x7fb5d329728ea185;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x7e25210b43d22bb3;
  return uVar1 >> 0x21 ^ uVar1;
}

Assistant:

inline uint64_t MixBits(uint64_t v) {
    v ^= (v >> 31);
    v *= 0x7fb5d329728ea185;
    v ^= (v >> 27);
    v *= 0x81dadef4bc2dd44d;
    v ^= (v >> 33);
    return v;
}